

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantTriangleSetCase::compare
          (InvariantTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  bool bVar1;
  TestLog *log;
  int param_3_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB_local;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA_local;
  InvariantTriangleSetCase *this_local;
  
  log = tcu::TestContext::getLog
                  ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx);
  bVar1 = compareTriangleSets(coordsA,coordsB,log);
  return bVar1;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog());
	}